

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapping0.c
# Opt level: O3

vorbis_info_mapping * mapping0_unpack(vorbis_info *vi,oggpack_buffer *opb)

{
  void *pvVar1;
  bool bVar2;
  uint uVar3;
  uint *__ptr;
  long lVar4;
  long lVar5;
  uint uVar6;
  uint uVar7;
  vorbis_info_mapping0 *info;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  
  __ptr = (uint *)calloc(1,0xc90);
  pvVar1 = vi->codec_setup;
  uVar9 = 1;
  lVar4 = oggpack_read(opb,1);
  if (lVar4 != 0) {
    lVar4 = oggpack_read(opb,4);
    uVar9 = (int)lVar4 + 1;
  }
  *__ptr = uVar9;
  lVar4 = oggpack_read(opb,1);
  if (lVar4 != 0) {
    lVar4 = oggpack_read(opb,8);
    uVar7 = (uint)lVar4 + 1;
    __ptr[0x123] = uVar7;
    if ((uint)lVar4 < 0x7fffffff) {
      uVar6 = vi->channels;
      lVar4 = 0;
      do {
        iVar8 = 0;
        if (1 < uVar6) {
          iVar8 = 0;
          uVar6 = uVar6 - 1;
          do {
            iVar8 = iVar8 + 1;
            bVar2 = 1 < uVar6;
            uVar6 = uVar6 >> 1;
          } while (bVar2);
        }
        lVar5 = oggpack_read(opb,iVar8);
        uVar11 = (uint)lVar5;
        __ptr[lVar4 + 0x124] = uVar11;
        iVar8 = 0;
        if (1 < (uint)vi->channels) {
          iVar8 = 0;
          uVar6 = vi->channels - 1;
          do {
            iVar8 = iVar8 + 1;
            bVar2 = 1 < uVar6;
            uVar6 = uVar6 >> 1;
          } while (bVar2);
        }
        lVar5 = oggpack_read(opb,iVar8);
        uVar3 = (uint)lVar5;
        __ptr[lVar4 + 0x224] = uVar3;
        if (((((int)uVar11 < 0) || ((int)uVar3 < 0)) || (uVar11 == uVar3)) ||
           ((uVar6 = vi->channels, (int)uVar6 <= (int)uVar11 || ((int)uVar6 <= (int)uVar3))))
        goto LAB_00121d56;
        lVar4 = lVar4 + 1;
      } while (lVar4 < (int)uVar7);
    }
  }
  lVar4 = oggpack_read(opb,2);
  if (0 < lVar4) goto LAB_00121d56;
  if ((int)uVar9 < 2) {
LAB_00121da5:
    if ((int)uVar9 < 1) {
      return __ptr;
    }
  }
  else if (0 < vi->channels) {
    lVar4 = 0;
    do {
      lVar5 = oggpack_read(opb,4);
      __ptr[lVar4 + 1] = (uint)lVar5;
      if ((int)uVar9 <= (int)(uint)lVar5) goto LAB_00121d56;
      lVar4 = lVar4 + 1;
    } while (lVar4 < vi->channels);
    goto LAB_00121da5;
  }
  uVar10 = 0;
  while (lVar4 = oggpack_read(opb,8), (int)lVar4 < *(int *)((long)pvVar1 + 0x18)) {
    lVar4 = oggpack_read(opb,8);
    __ptr[uVar10 + 0x101] = (uint)lVar4;
    if (*(int *)((long)pvVar1 + 0x1c) <= (int)(uint)lVar4) break;
    lVar4 = oggpack_read(opb,8);
    __ptr[uVar10 + 0x111] = (uint)lVar4;
    if (*(int *)((long)pvVar1 + 0x20) <= (int)(uint)lVar4) break;
    uVar10 = uVar10 + 1;
    if (uVar9 == uVar10) {
      return __ptr;
    }
  }
LAB_00121d56:
  free(__ptr);
  return (vorbis_info_mapping *)0x0;
}

Assistant:

static vorbis_info_mapping *mapping0_unpack(vorbis_info *vi,oggpack_buffer *opb){
  int i;
  vorbis_info_mapping0 *info=(vorbis_info_mapping0 *)_ogg_calloc(1,sizeof(*info));
  codec_setup_info     *ci=(codec_setup_info *)vi->codec_setup;
  memset(info,0,sizeof(*info));

  if(oggpack_read(opb,1))
    info->submaps=oggpack_read(opb,4)+1;
  else
    info->submaps=1;

  if(oggpack_read(opb,1)){
    info->coupling_steps=oggpack_read(opb,8)+1;

    for(i=0;i<info->coupling_steps;i++){
      int testM=info->coupling_mag[i]=oggpack_read(opb,ilog(vi->channels));
      int testA=info->coupling_ang[i]=oggpack_read(opb,ilog(vi->channels));

      if(testM<0 || 
	 testA<0 || 
	 testM==testA || 
	 testM>=vi->channels ||
	 testA>=vi->channels) goto err_out;
    }

  }

  if(oggpack_read(opb,2)>0)goto err_out; /* 2,3:reserved */
    
  if(info->submaps>1){
    for(i=0;i<vi->channels;i++){
      info->chmuxlist[i]=oggpack_read(opb,4);
      if(info->chmuxlist[i]>=info->submaps)goto err_out;
    }
  }
  for(i=0;i<info->submaps;i++){
    int temp=oggpack_read(opb,8);
    if(temp>=ci->times)goto err_out;
    info->floorsubmap[i]=oggpack_read(opb,8);
    if(info->floorsubmap[i]>=ci->floors)goto err_out;
    info->residuesubmap[i]=oggpack_read(opb,8);
    if(info->residuesubmap[i]>=ci->residues)goto err_out;
  }

  return info;

 err_out:
  mapping0_free_info(info);
  return(NULL);
}